

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

size_t __thiscall
Assimp::ColladaParser::ReadPrimitives
          (ColladaParser *this,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t pNumPrimitives,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount,PrimitiveType pPrimType)

{
  size_t sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar2;
  unsigned_long *puVar3;
  reference puVar4;
  int *piVar5;
  size_type sVar6;
  reference pIVar7;
  Accessor *pAVar8;
  Data *pDVar9;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *this_01;
  const_reference pvVar10;
  allocator<char> local_219;
  string local_218;
  ulong local_1f8;
  size_t currentVertex_4;
  size_t currentVertex_3;
  size_t currentVertex_2;
  size_t currentVertex_1;
  size_t currentVertex;
  size_t numPoints;
  size_t currentPrimitive;
  size_t polylistStartVertex;
  size_t numberOfVertices_1;
  size_t numberOfVertices;
  size_t numPrimitives;
  Accessor *acc_1;
  string local_190;
  reference local_170;
  InputChannel *input_1;
  __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
  local_160;
  iterator it_1;
  Accessor *acc;
  InputChannel *input;
  __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
  local_140;
  iterator it;
  string local_130;
  allocator<char> local_109;
  string local_108;
  value_type_conflict3 local_e8;
  int local_dc [3];
  char *pcStack_d0;
  int value;
  char *content;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  size_t i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t expectedPointCount;
  reference local_70;
  InputChannel *channel;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *__range1;
  size_t perVertexOffset;
  size_t numOffsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_38;
  PrimitiveType pPrimType_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount_local;
  size_t pNumPrimitives_local;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
  *pPerIndexChannels_local;
  Mesh *pMesh_local;
  ColladaParser *this_local;
  
  perVertexOffset = 1;
  __range1 = (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              *)0xffffffffffffffff;
  numOffsets._4_4_ = pPrimType;
  pvStack_38 = pVCount;
  pVCount_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)pNumPrimitives;
  pNumPrimitives_local = (size_t)pPerIndexChannels;
  pPerIndexChannels_local =
       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *)
       pMesh;
  pMesh_local = (Mesh *)this;
  __end1 = std::
           vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
           begin(pPerIndexChannels);
  channel = (InputChannel *)
            std::
            vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
            end(pPerIndexChannels);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
                                     *)&channel), this_00 = pvStack_38, bVar2) {
    local_70 = __gnu_cxx::
               __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
               ::operator*(&__end1);
    expectedPointCount = local_70->mOffset + 1;
    puVar3 = std::max<unsigned_long>(&perVertexOffset,&expectedPointCount);
    perVertexOffset = *puVar3;
    if (local_70->mType == IT_Vertex) {
      __range1 = (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                  *)local_70->mOffset;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
    ::operator++(&__end1);
  }
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  if (numOffsets._4_4_ == Prim_Lines) {
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)pVCount_local << 1);
  }
  else if (numOffsets._4_4_ == Prim_Triangles) {
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)pVCount_local * 3);
  }
  else if (numOffsets._4_4_ == Prim_Polylist) {
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvStack_38);
    i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&i), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
      __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + (long)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  if (__range2 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,
               (long)__range2 * perVertexOffset);
  }
  if (pVCount_local != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    pcStack_d0 = GetTextContent(this);
    while (*pcStack_d0 != '\0') {
      local_dc[1] = 0;
      local_dc[0] = strtol10(pcStack_d0,&stack0xffffffffffffff30);
      piVar5 = std::max<int>(local_dc + 1,local_dc);
      local_dc[2] = *piVar5;
      local_e8 = (value_type_conflict3)local_dc[2];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,&local_e8);
      SkipSpacesAndLineEnd<char>(&stack0xffffffffffffff30);
    }
  }
  if ((__range2 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) ||
     (sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8),
     sVar6 == (long)__range2 * perVertexOffset)) {
    if ((__range2 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) &&
       (sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8),
       sVar6 % perVertexOffset != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"Expected different index count in <p> element.",
                 (allocator<char> *)((long)&it._M_current + 7));
      ThrowException(this,&local_130);
    }
  }
  else {
    if (numOffsets._4_4_ != Prim_Lines) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected different index count in <p> element.",&local_109);
      ThrowException(this,&local_108);
    }
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
    ReportWarning(this,"Expected different index count in <p> element, %zu instead of %zu.",sVar6);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
    pVCount_local =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(sVar6 / perVertexOffset >> 1);
  }
  local_140._M_current =
       (InputChannel *)
       std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
       begin((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              *)&pPerIndexChannels_local[2].
                 super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    input = (InputChannel *)
            std::
            vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
            end((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                 *)&pPerIndexChannels_local[2].
                    super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=
                      (&local_140,
                       (__normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
                        *)&input);
    if (!bVar2) break;
    pIVar7 = __gnu_cxx::
             __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
             ::operator*(&local_140);
    if (pIVar7->mResolved == (Accessor *)0x0) {
      pAVar8 = ResolveLibraryReference<Assimp::Collada::Accessor>
                         (this,&this->mAccessorLibrary,&pIVar7->mAccessor);
      pIVar7->mResolved = pAVar8;
      it_1._M_current = (InputChannel *)pIVar7->mResolved;
      if (((Accessor *)it_1._M_current)->mData == (Data *)0x0) {
        pAVar8 = (Accessor *)
                 ResolveLibraryReference<Assimp::Collada::Data>
                           (this,&this->mDataLibrary,&((Accessor *)it_1._M_current)->mSource);
        it_1._M_current[1].mResolved = pAVar8;
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
    ::operator++(&local_140);
  }
  local_160._M_current =
       (InputChannel *)
       std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
       begin((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              *)pNumPrimitives_local);
  do {
    input_1 = (InputChannel *)
              std::
              vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              ::end((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                     *)pNumPrimitives_local);
    bVar2 = __gnu_cxx::operator!=
                      (&local_160,
                       (__normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
                        *)&input_1);
    if (!bVar2) {
      numberOfVertices = (size_t)pVCount_local;
      if ((numOffsets._4_4_ == Prim_TriFans) || (numOffsets._4_4_ == Prim_Polygon)) {
        numberOfVertices = 1;
      }
      if (numOffsets._4_4_ == Prim_TriStrips) {
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
        numberOfVertices_1 = sVar6 / perVertexOffset;
        numberOfVertices = numberOfVertices_1 - 2;
      }
      if (numOffsets._4_4_ == Prim_LineStrip) {
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
        polylistStartVertex = sVar6 / perVertexOffset;
        numberOfVertices = polylistStartVertex - 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (pPerIndexChannels_local + 0x19),numberOfVertices);
      this_01 = pPerIndexChannels_local + 0x1a;
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
                 sVar6 / perVertexOffset);
      currentPrimitive = 0;
      for (numPoints = 0; numPoints < numberOfVertices; numPoints = numPoints + 1) {
        currentVertex = 0;
        switch(numOffsets._4_4_) {
        case Prim_Lines:
          currentVertex = 2;
          for (currentVertex_1 = 0; currentVertex_1 < currentVertex;
              currentVertex_1 = currentVertex_1 + 1) {
            CopyVertex(this,currentVertex_1,perVertexOffset,currentVertex,(size_t)__range1,
                       (Mesh *)pPerIndexChannels_local,
                       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                        *)pNumPrimitives_local,numPoints,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          }
          break;
        case Prim_LineStrip:
          currentVertex = 2;
          for (currentVertex_2 = 0; currentVertex_2 < currentVertex;
              currentVertex_2 = currentVertex_2 + 1) {
            CopyVertex(this,currentVertex_2,perVertexOffset,1,(size_t)__range1,
                       (Mesh *)pPerIndexChannels_local,
                       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                        *)pNumPrimitives_local,numPoints,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          }
          break;
        case Prim_Triangles:
          currentVertex = 3;
          for (currentVertex_3 = 0; currentVertex_3 < currentVertex;
              currentVertex_3 = currentVertex_3 + 1) {
            CopyVertex(this,currentVertex_3,perVertexOffset,currentVertex,(size_t)__range1,
                       (Mesh *)pPerIndexChannels_local,
                       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                        *)pNumPrimitives_local,numPoints,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          }
          break;
        case Prim_TriStrips:
          currentVertex = 3;
          ReadPrimTriStrips(this,perVertexOffset,(size_t)__range1,(Mesh *)pPerIndexChannels_local,
                            (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                             *)pNumPrimitives_local,numPoints,
                            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          break;
        case Prim_TriFans:
        case Prim_Polygon:
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          currentVertex = sVar6 / perVertexOffset;
          for (local_1f8 = 0; local_1f8 < currentVertex; local_1f8 = local_1f8 + 1) {
            CopyVertex(this,local_1f8,perVertexOffset,currentVertex,(size_t)__range1,
                       (Mesh *)pPerIndexChannels_local,
                       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                        *)pNumPrimitives_local,numPoints,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          }
          break;
        case Prim_Polylist:
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (pvStack_38,numPoints);
          currentVertex = *pvVar10;
          for (currentVertex_4 = 0; currentVertex_4 < currentVertex;
              currentVertex_4 = currentVertex_4 + 1) {
            CopyVertex(this,currentPrimitive + currentVertex_4,perVertexOffset,1,(size_t)__range1,
                       (Mesh *)pPerIndexChannels_local,
                       (vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                        *)pNumPrimitives_local,0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
          }
          currentPrimitive = currentVertex + currentPrimitive;
          break;
        default:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,"Unsupported primitive type.",&local_219);
          ThrowException(this,&local_218);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (pPerIndexChannels_local + 0x19),&currentVertex);
      }
      TestClosing(this,"p");
      sVar1 = numberOfVertices;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
      return sVar1;
    }
    local_170 = __gnu_cxx::
                __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
                ::operator*(&local_160);
    if (local_170->mResolved == (Accessor *)0x0) {
      if (local_170->mType == IT_Vertex) {
        bVar2 = std::operator!=(&local_170->mAccessor,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pPerIndexChannels_local[1].
                                  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"Unsupported vertex referencing scheme.",
                     (allocator<char> *)((long)&acc_1 + 7));
          ThrowException(this,&local_190);
        }
      }
      else {
        pAVar8 = ResolveLibraryReference<Assimp::Collada::Accessor>
                           (this,&this->mAccessorLibrary,&local_170->mAccessor);
        local_170->mResolved = pAVar8;
        numPrimitives = (size_t)local_170->mResolved;
        if (((Accessor *)numPrimitives)->mData == (Data *)0x0) {
          pDVar9 = ResolveLibraryReference<Assimp::Collada::Data>
                             (this,&this->mDataLibrary,&((Accessor *)numPrimitives)->mSource);
          *(Data **)(numPrimitives + 0x78) = pDVar9;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
    ::operator++(&local_160);
  } while( true );
}

Assistant:

size_t ColladaParser::ReadPrimitives(Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels,
    size_t pNumPrimitives, const std::vector<size_t>& pVCount, PrimitiveType pPrimType)
{
    // determine number of indices coming per vertex
    // find the offset index for all per-vertex channels
    size_t numOffsets = 1;
    size_t perVertexOffset = SIZE_MAX; // invalid value
    for (const InputChannel& channel : pPerIndexChannels)
    {
        numOffsets = std::max(numOffsets, channel.mOffset + 1);
        if (channel.mType == IT_Vertex)
            perVertexOffset = channel.mOffset;
    }

    // determine the expected number of indices
    size_t expectedPointCount = 0;
    switch (pPrimType)
    {
    case Prim_Polylist:
    {
        for (size_t i : pVCount)
            expectedPointCount += i;
        break;
    }
    case Prim_Lines:
        expectedPointCount = 2 * pNumPrimitives;
        break;
    case Prim_Triangles:
        expectedPointCount = 3 * pNumPrimitives;
        break;
    default:
        // other primitive types don't state the index count upfront... we need to guess
        break;
    }

    // and read all indices into a temporary array
    std::vector<size_t> indices;
    if (expectedPointCount > 0)
        indices.reserve(expectedPointCount * numOffsets);

    if (pNumPrimitives > 0) // It is possible to not contain any indices
    {
        const char* content = GetTextContent();
        while (*content != 0)
        {
            // read a value.
            // Hack: (thom) Some exporters put negative indices sometimes. We just try to carry on anyways.
            int value = std::max(0, strtol10(content, &content));
            indices.push_back(size_t(value));
            // skip whitespace after it
            SkipSpacesAndLineEnd(&content);
        }
    }

    // complain if the index count doesn't fit
    if (expectedPointCount > 0 && indices.size() != expectedPointCount * numOffsets) {
        if (pPrimType == Prim_Lines) {
            // HACK: We just fix this number since SketchUp 15.3.331 writes the wrong 'count' for 'lines'
            ReportWarning("Expected different index count in <p> element, %zu instead of %zu.", indices.size(), expectedPointCount * numOffsets);
            pNumPrimitives = (indices.size() / numOffsets) / 2;
        }
        else
            ThrowException("Expected different index count in <p> element.");

    }
    else if (expectedPointCount == 0 && (indices.size() % numOffsets) != 0)
        ThrowException("Expected different index count in <p> element.");

    // find the data for all sources
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }
    // and the same for the per-index channels
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // ignore vertex pointer, it doesn't refer to an accessor
        if (input.mType == IT_Vertex)
        {
            // warn if the vertex channel does not refer to the <vertices> element in the same mesh
            if (input.mAccessor != pMesh->mVertexID)
                ThrowException("Unsupported vertex referencing scheme.");
            continue;
        }

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }

    // For continued primitives, the given count does not come all in one <p>, but only one primitive per <p>
    size_t numPrimitives = pNumPrimitives;
    if (pPrimType == Prim_TriFans || pPrimType == Prim_Polygon)
        numPrimitives = 1;
    // For continued primitives, the given count is actually the number of <p>'s inside the parent tag
    if (pPrimType == Prim_TriStrips) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 2;
    }
    if (pPrimType == Prim_LineStrip) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 1;
    }

    pMesh->mFaceSize.reserve(numPrimitives);
    pMesh->mFacePosIndices.reserve(indices.size() / numOffsets);

    size_t polylistStartVertex = 0;
    for (size_t currentPrimitive = 0; currentPrimitive < numPrimitives; currentPrimitive++)
    {
        // determine number of points for this primitive
        size_t numPoints = 0;
        switch (pPrimType)
        {
        case Prim_Lines:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_LineStrip:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Triangles:
            numPoints = 3;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_TriStrips:
            numPoints = 3;
            ReadPrimTriStrips(numOffsets, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Polylist:
            numPoints = pVCount[currentPrimitive];
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(polylistStartVertex + currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, 0, indices);
            polylistStartVertex += numPoints;
            break;
        case Prim_TriFans:
        case Prim_Polygon:
            numPoints = indices.size() / numOffsets;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        default:
            // LineStrip is not supported due to expected index unmangling
            ThrowException("Unsupported primitive type.");
            break;
        }

        // store the face size to later reconstruct the face from
        pMesh->mFaceSize.push_back(numPoints);
    }

    // if I ever get my hands on that guy who invented this steaming pile of indirection...
    TestClosing("p");
    return numPrimitives;
}